

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O3

void voutf(GlobalConfig *config,char *prefix,char *fmt,__va_list_tag *ap)

{
  long lVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  char *__s;
  size_t sVar6;
  char *__s_00;
  long lVar7;
  
  uVar4 = get_terminal_columns();
  sVar5 = strlen(prefix);
  if ((config->silent != false) || (__s = (char *)curl_mvaprintf(fmt,ap), __s == (char *)0x0)) {
    return;
  }
  sVar6 = strlen(__s);
  if (sVar6 != 0) {
    lVar1 = (uVar4 - sVar5) - 1;
    __s_00 = __s;
    do {
      fputs(prefix,(FILE *)tool_stderr);
      if (sVar6 <= uVar4 - sVar5) {
        fputs(__s_00,(FILE *)tool_stderr);
        fputs("\n",(FILE *)tool_stderr);
        break;
      }
      cVar2 = __s_00[lVar1];
      lVar7 = lVar1;
      while (((cVar2 != ' ' && (lVar7 != 0)) && (cVar2 != '\t'))) {
        lVar3 = lVar7 + -1;
        lVar7 = lVar7 + -1;
        cVar2 = __s_00[lVar3];
      }
      if (lVar7 == 0) {
        lVar7 = lVar1;
      }
      fwrite(__s_00,lVar7 + 1U,1,(FILE *)tool_stderr);
      fputs("\n",(FILE *)tool_stderr);
      __s_00 = __s_00 + lVar7 + 1;
      sVar6 = sVar6 - (lVar7 + 1U);
    } while (sVar6 != 0);
  }
  curl_free(__s);
  return;
}

Assistant:

static void voutf(struct GlobalConfig *config,
                  const char *prefix,
                  const char *fmt,
                  va_list ap)
{
  size_t width = (get_terminal_columns() - strlen(prefix));
  DEBUGASSERT(!strchr(fmt, '\n'));
  if(!config->silent) {
    size_t len;
    char *ptr;
    char *print_buffer;

    print_buffer = vaprintf(fmt, ap);
    if(!print_buffer)
      return;
    len = strlen(print_buffer);

    ptr = print_buffer;
    while(len > 0) {
      fputs(prefix, tool_stderr);

      if(len > width) {
        size_t cut = width-1;

        while(!ISBLANK(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = width-1;

        (void)fwrite(ptr, cut + 1, 1, tool_stderr);
        fputs("\n", tool_stderr);
        ptr += cut + 1; /* skip the space too */
        len -= cut + 1;
      }
      else {
        fputs(ptr, tool_stderr);
        fputs("\n", tool_stderr);
        len = 0;
      }
    }
    curl_free(print_buffer);
  }
}